

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall flatbuffers::RPCCall::Deserialize(RPCCall *this,Parser *parser,RPCCall *call)

{
  bool bVar1;
  String *pSVar2;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  Object *pOVar3;
  StructDef *pSVar4;
  string local_40;
  
  pSVar2 = reflection::RPCCall::name(call);
  String::str_abi_cxx11_(&local_40,pSVar2);
  std::__cxx11::string::operator=((string *)this,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  attrs = reflection::RPCCall::attributes(call);
  bVar1 = DeserializeAttributesCommon(&(this->super_Definition).attributes,parser,attrs);
  if (bVar1) {
    documentation = reflection::RPCCall::documentation(call);
    anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
    pOVar3 = reflection::RPCCall::request(call);
    pSVar2 = reflection::Object::name(pOVar3);
    String::str_abi_cxx11_(&local_40,pSVar2);
    pSVar4 = SymbolTable<flatbuffers::StructDef>::Lookup(&parser->structs_,&local_40);
    this->request = pSVar4;
    std::__cxx11::string::~string((string *)&local_40);
    pOVar3 = reflection::RPCCall::response(call);
    pSVar2 = reflection::Object::name(pOVar3);
    String::str_abi_cxx11_(&local_40,pSVar2);
    pSVar4 = SymbolTable<flatbuffers::StructDef>::Lookup(&parser->structs_,&local_40);
    this->response = pSVar4;
    std::__cxx11::string::~string((string *)&local_40);
    bVar1 = this->response != (StructDef *)0x0 && this->request != (StructDef *)0x0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RPCCall::Deserialize(Parser &parser, const reflection::RPCCall *call) {
  name = call->name()->str();
  if (!DeserializeAttributes(parser, call->attributes())) return false;
  DeserializeDoc(doc_comment, call->documentation());
  request = parser.structs_.Lookup(call->request()->name()->str());
  response = parser.structs_.Lookup(call->response()->name()->str());
  if (!request || !response) { return false; }
  return true;
}